

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O3

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>::Initialize
          (TPZGeoBlend<pzgeom::TPZGeoTriangle> *this,TPZGeoEl *refel)

{
  char cVar1;
  int iVar2;
  int col;
  uint uVar3;
  TPZGeoElSide NextSide;
  TPZGeoElSide NeighSide;
  TPZGeoElSide ElemSide;
  TPZTransform<double> NeighTransf;
  undefined1 local_238 [8];
  TPZGeoEl *local_230;
  int local_228;
  TPZGeoBlend<pzgeom::TPZGeoTriangle> *local_220;
  TPZGeoElSide local_218;
  TPZGeoElSide local_200;
  TPZGeoElSide local_1e8;
  undefined1 local_1d0 [8];
  TPZGeoEl *local_1c8;
  int local_1c0;
  
  this->fGeoEl = refel;
  uVar3 = 3;
  local_220 = this;
  do {
    iVar2 = (**(code **)(*(long *)refel + 0x140))(refel,uVar3);
    if (iVar2 == 0) {
      local_200.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_018f8760;
      local_200.fGeoEl = refel;
      local_200.fSide = uVar3;
      (**(code **)(*(long *)refel + 0x188))(local_238,refel,uVar3);
      if (local_230 != (TPZGeoEl *)0x0) {
        while (local_230 != local_200.fGeoEl) {
          if ((((local_230 != (TPZGeoEl *)0x0) && (-1 < local_228)) &&
              (cVar1 = (**(code **)(*(long *)local_230 + 0xd0))(local_230), cVar1 == '\0')) &&
             (cVar1 = (**(code **)(*(long *)local_230 + 0xe0))(local_230), cVar1 == '\0')) {
            local_218.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_018f8760;
            local_218.fSide = local_228;
            local_218.fGeoEl = local_230;
            iVar2 = TPZGeoElSide::Dimension(&local_218);
            col = TPZGeoElSide::Dimension(&local_218);
            TPZTransform<double>::TPZTransform((TPZTransform<double> *)local_1d0,iVar2,col);
            local_1e8.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_018f8760;
            local_1e8.fSide = local_218.fSide;
            local_1e8.fGeoEl = local_218.fGeoEl;
            TPZGeoElSide::SideTransform3(&local_200,&local_1e8,(TPZTransform<double> *)local_1d0);
            (*(local_220->super_TPZGeoTriangle).super_TPZNodeRep<3,_pztopology::TPZTriangle>.
              super_TPZTriangle.super_TPZSavable._vptr_TPZSavable[9])
                      (local_220,(ulong)uVar3,&local_218,(TPZTransform<double> *)local_1d0);
            TPZTransform<double>::~TPZTransform((TPZTransform<double> *)local_1d0);
            break;
          }
          if (local_230 == (TPZGeoEl *)0x0) {
            local_1d0 = (undefined1  [8])&PTR__TPZGeoElSide_018f8760;
            local_1c8 = (TPZGeoEl *)0x0;
            local_1c0 = -1;
          }
          else {
            (**(code **)(*(long *)local_230 + 0x188))
                      ((TPZTransform<double> *)local_1d0,local_230,local_228);
          }
          local_228 = local_1c0;
          local_230 = local_1c8;
        }
      }
    }
    uVar3 = uVar3 + 1;
    if (uVar3 == 7) {
      return;
    }
  } while( true );
}

Assistant:

void pzgeom::TPZGeoBlend<TGeo>::Initialize(TPZGeoEl *refel)
{
    fGeoEl = refel;
    for(int byside = TGeo::NNodes; byside < (TGeo::NSides); byside++)
    {
        if (refel->SideIsUndefined(byside)) {
            continue;
        }
        TPZGeoElSide ElemSide(refel,byside);
        TPZGeoElSide NextSide(ElemSide.Neighbour());
        if(!NextSide.Element()) continue;
        while(NextSide.Element() != ElemSide.Element())
        {
            if(NextSide.Exists() && !NextSide.Element()->IsLinearMapping() && !NextSide.Element()->IsGeoBlendEl())
            {
                TPZGeoElSide NeighSide = NextSide;
                TPZTransform<> NeighTransf(NeighSide.Dimension(),NeighSide.Dimension());
                ElemSide.SideTransform3(NeighSide,NeighTransf);
                SetNeighbourInfo(byside,NeighSide,NeighTransf);
                break;
            }
            NextSide = NextSide.Neighbour();
        }
    }
}